

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArenaFast
          (ThreadSafeArena *this,SerialArena **arena)

{
  long lVar1;
  SerialArena *pSVar2;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -0x38) == *(long *)this) {
    pSVar2 = *(SerialArena **)(lVar1 + -0x30);
  }
  else {
    pSVar2 = *(SerialArena **)(this + 0x18);
    if ((pSVar2 == (SerialArena *)0x0) || (pSVar2->owner_ != (void *)(lVar1 + -0x40))) {
      return false;
    }
  }
  *arena = pSVar2;
  return true;
}

Assistant:

PROTOBUF_NDEBUG_INLINE bool GetSerialArenaFast(SerialArena** arena) {
    if (GetSerialArenaFromThreadCache(arena)) return true;

    // Check whether we own the last accessed SerialArena on this arena.  This
    // fast path optimizes the case where a single thread uses multiple arenas.
    ThreadCache* tc = &thread_cache();
    SerialArena* serial = hint_.load(std::memory_order_acquire);
    if (PROTOBUF_PREDICT_TRUE(serial != NULL && serial->owner() == tc)) {
      *arena = serial;
      return true;
    }
    return false;
  }